

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *this_00;
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  TargetType TVar4;
  cmComputeLinkInformation *pcli_00;
  char *pcVar5;
  ulong uVar6;
  reference ppcVar7;
  string *psVar8;
  bool local_51a;
  byte local_502;
  allocator local_491;
  undefined1 local_490 [8];
  string configLinkFlags_1;
  string local_468;
  char *local_448;
  char *targetLinkFlags_1;
  string cmp0065Flags;
  undefined1 local_418 [8];
  string exportFlagVar;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  allocator local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  string sFlagVar;
  string local_2e8;
  undefined4 local_2c8;
  allocator local_2c1;
  undefined1 local_2c0 [8];
  string build_1;
  string local_298;
  allocator local_271;
  undefined1 local_270 [8];
  string configLinkFlags;
  string local_248;
  char *local_228;
  char *targetLinkFlags;
  string local_200;
  cmSourceFile *local_1e0;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1d0;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1c8;
  const_iterator i;
  string local_1b8;
  string local_198 [8];
  string defFlag;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_158;
  byte local_133;
  byte local_132;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  undefined1 local_e0 [8];
  string build;
  string local_b8;
  undefined1 local_98 [8];
  string linkLanguage;
  char *libraryLinkVariable;
  cmComputeLinkInformation *pcli;
  string buildType;
  string *linkFlags_local;
  string *flags_local;
  string *linkLibs_local;
  string *config_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmLocalGenerator *this_local;
  
  buildType.field_2._8_8_ = linkFlags;
  cmsys::SystemTools::UpperCase((string *)&pcli,config);
  pcli_00 = cmGeneratorTarget::GetLinkInformation(target,config);
  linkLanguage.field_2._8_8_ = anon_var_dwarf_28fe2a;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(local_98,linkLineComputer,target,&pcli);
  TVar4 = cmGeneratorTarget::GetType(target);
  switch(TVar4) {
  case EXECUTABLE:
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_298,"CMAKE_EXE_LINKER_FLAGS",
               (allocator *)(build_1.field_2._M_local_buf + 0xf));
    pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_298);
    std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)(build_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2c0,"CMAKE_EXE_LINKER_FLAGS_",&local_2c1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::__cxx11::string::operator+=((string *)local_2c0,(string *)&pcli);
      pcVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2c0);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      std::__cxx11::string::~string((string *)local_2c0);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      cmGeneratorTarget::GetName_abi_cxx11_(target);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",pcVar5,(char *)0x0,
                 (char *)0x0);
      local_2c8 = 1;
      goto LAB_0068cea6;
    }
    AddLanguageFlagsForLinking(this,flags,target,(string *)local_98,(string *)&pcli);
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e8,"BUILD_SHARED_LIBS",
               (allocator *)(sFlagVar.field_2._M_local_buf + 0xf));
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_2e8);
    bVar3 = cmSystemTools::IsOn(pcVar5);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_350,"CMAKE_SHARED_BUILD_",&local_351);
      std::operator+(&local_330,&local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_378,"_FLAGS",&local_379);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                     &local_330,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      pcVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_310);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      std::__cxx11::string::~string((string *)local_310);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"WIN32_EXECUTABLE",&local_3a1);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    if (bVar3) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c8,"CMAKE_CREATE_WIN32_EXE",&local_3c9);
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_3c8);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    else {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3f0,"CMAKE_CREATE_CONSOLE_EXE",
                 (allocator *)(exportFlagVar.field_2._M_local_buf + 0xf));
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_3f0);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(exportFlagVar.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_418,"CMAKE_EXE_EXPORTS_",
                 (allocator *)(cmp0065Flags.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(cmp0065Flags.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_418,(string *)local_98);
      std::__cxx11::string::operator+=((string *)local_418,"_FLAG");
      pcVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_418);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      std::__cxx11::string::~string((string *)local_418);
    }
    GetLinkLibsCMP0065((string *)&targetLinkFlags_1,this,(string *)local_98,target);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)buildType.field_2._8_8_,(string *)&targetLinkFlags_1);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_468,"LINK_FLAGS",
               (allocator *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
    pcVar5 = cmGeneratorTarget::GetProperty(target,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator
              ((allocator<char> *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
    local_448 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_490,"LINK_FLAGS_",&local_491);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
      std::__cxx11::string::operator+=((string *)local_490,(string *)&pcli);
      local_448 = cmGeneratorTarget::GetProperty(target,(string *)local_490);
      if (local_448 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_448);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      std::__cxx11::string::~string((string *)local_490);
    }
    std::__cxx11::string::~string((string *)&targetLinkFlags_1);
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,(string *)buildType.field_2._8_8_,(string *)&pcli,target);
    break;
  case MODULE_LIBRARY:
    linkLanguage.field_2._8_8_ = anon_var_dwarf_28fe36;
  case SHARED_LIBRARY:
    uVar2 = linkLanguage.field_2._8_8_;
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b8,(char *)uVar2,(allocator *)(build.field_2._M_local_buf + 0xf));
    pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
    std::__cxx11::string::operator=((string *)buildType.field_2._8_8_,pcVar5);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(build.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    uVar6 = std::__cxx11::string::empty();
    uVar2 = linkLanguage.field_2._8_8_;
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_e0,(char *)uVar2,&local_e1);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::operator+=((string *)local_e0,"_");
      std::__cxx11::string::operator+=((string *)local_e0,(string *)&pcli);
      pcVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_e0);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      std::__cxx11::string::~string((string *)local_e0);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_132 = 0;
    local_133 = 0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    std::__cxx11::string::string((string *)&local_108,"WIN32",&local_109);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_108);
    local_502 = 0;
    if (bVar3) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_132 = 1;
      std::__cxx11::string::string((string *)&local_130,"CYGWIN",&local_131);
      local_133 = 1;
      bVar3 = cmMakefile::IsOn(pcVar1,&local_130);
      local_51a = true;
      if (!bVar3) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_158,"MINGW",
                   (allocator *)
                   ((long)&sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_51a = cmMakefile::IsOn(pcVar1,&local_158);
      }
      local_502 = local_51a ^ 0xff;
    }
    if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    if ((local_133 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    if ((local_132 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
    }
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    if ((local_502 & 1) != 0) {
      this_00 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                ((long)&defFlag.field_2 + 8);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(this_00);
      cmGeneratorTarget::GetSourceFiles(target,this_00,(string *)&pcli);
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1b8,"CMAKE_LINK_DEF_FILE_FLAG",
                 (allocator *)((long)&i._M_current + 7));
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,pcVar5,(allocator *)((long)&i._M_current + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 6));
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
      local_1d0._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                      ((long)&defFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_1c8,&local_1d0);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                        ((long)&defFlag.field_2 + 8));
        bVar3 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar3) break;
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_1c8);
        local_1e0 = *ppcVar7;
        psVar8 = cmSourceFile::GetExtension_abi_cxx11_(local_1e0);
        bVar3 = std::operator==(psVar8,"def");
        if (bVar3) {
          std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_198);
          psVar8 = cmSourceFile::GetFullPath(local_1e0,(string *)0x0);
          cmsys::SystemTools::CollapseFullPath((string *)&targetLinkFlags,psVar8);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_200,&this->super_cmOutputConverter,(string *)&targetLinkFlags,SHELL);
          std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&targetLinkFlags);
          std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
        }
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_1c8);
      }
      std::__cxx11::string::~string(local_198);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                 ((long)&defFlag.field_2 + 8));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_248,"LINK_FLAGS",
               (allocator *)(configLinkFlags.field_2._M_local_buf + 0xf));
    pcVar5 = cmGeneratorTarget::GetProperty(target,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator
              ((allocator<char> *)(configLinkFlags.field_2._M_local_buf + 0xf));
    local_228 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,pcVar5);
      std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_270,"LINK_FLAGS_",&local_271);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::__cxx11::string::operator+=((string *)local_270,(string *)&pcli);
      local_228 = cmGeneratorTarget::GetProperty(target,(string *)local_270);
      if (local_228 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_,local_228);
        std::__cxx11::string::operator+=((string *)buildType.field_2._8_8_," ");
      }
      std::__cxx11::string::~string((string *)local_270);
    }
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
  }
  AppendIPOLinkerFlags(this,(string *)buildType.field_2._8_8_,target,config,(string *)local_98);
  local_2c8 = 0;
LAB_0068cea6:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&pcli);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (this->Makefile->IsOn("WIN32") &&
          !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW"))) {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        std::string defFlag =
          this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
        for (std::vector<cmSourceFile*>::const_iterator i = sources.begin();
             i != sources.end(); ++i) {
          cmSourceFile* sf = *i;
          if (sf->GetExtension() == "def") {
            linkFlags += defFlag;
            linkFlags += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
            linkFlags += " ";
          }
        }
      }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkFlags += this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (linkLanguage.empty()) {
        cmSystemTools::Error(
          "CMake can not determine linker language for target: ",
          target->GetName().c_str());
        return;
      }
      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }
      if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
      } else {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
      }
      if (target->IsExecutableWithExports()) {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
    } break;
    default:
      break;
  }

  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}